

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

Polynomial<int32_t,_double> * anon_unknown.dwarf_c8515::GeneratePolynomialINT(void)

{
  void *pvVar1;
  long lVar2;
  Polynomial<int32_t,_double> *in_RDI;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  allocator_type local_407;
  allocator_type local_406;
  allocator_type local_405;
  allocator_type local_404;
  allocator_type local_403;
  allocator_type local_402;
  allocator_type local_401;
  allocator_type local_400;
  allocator_type local_3ff;
  allocator_type local_3fe;
  allocator_type local_3fd;
  allocator_type local_3fc;
  allocator_type local_3fb;
  allocator_type local_3fa;
  allocator_type local_3f9;
  vector<int,_std::allocator<int>_> local_3f8;
  vector<int,_std::allocator<int>_> local_3e0;
  vector<int,_std::allocator<int>_> local_3c8;
  vector<int,_std::allocator<int>_> local_3b0;
  vector<int,_std::allocator<int>_> local_398;
  vector<int,_std::allocator<int>_> local_380;
  vector<int,_std::allocator<int>_> local_368;
  vector<int,_std::allocator<int>_> local_350;
  vector<int,_std::allocator<int>_> local_338;
  vector<int,_std::allocator<int>_> local_320;
  vector<int,_std::allocator<int>_> local_308;
  vector<int,_std::allocator<int>_> local_2f0;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  int local_290 [24];
  undefined1 local_230 [12];
  undefined4 local_224;
  long local_220 [2];
  vector<int,_std::allocator<int>_> local_210;
  undefined8 local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  undefined8 local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 *local_1b8;
  vector<int,_std::allocator<int>_> local_1b0;
  undefined8 local_198;
  vector<int,_std::allocator<int>_> local_190;
  undefined8 local_178;
  vector<int,_std::allocator<int>_> local_170;
  undefined1 *local_158;
  vector<int,_std::allocator<int>_> local_150;
  undefined8 local_138;
  vector<int,_std::allocator<int>_> local_130;
  undefined8 local_118;
  vector<int,_std::allocator<int>_> local_110;
  undefined8 local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  undefined8 local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  undefined8 local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined8 local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined8 local_78;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined8 local_38;
  
  local_290[3] = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = local_290 + 3;
  std::vector<int,_std::allocator<int>_>::vector(&local_2a8,__l,&local_3f9);
  std::vector<int,_std::allocator<int>_>::vector(&local_210,&local_2a8);
  local_1f8 = 0x3ff0000000000000;
  local_290[2] = 0xfffffffe;
  __l_00._M_len = 1;
  __l_00._M_array = local_290 + 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_2c0,__l_00,&local_3fa);
  std::vector<int,_std::allocator<int>_>::vector(&local_1f0,&local_2c0);
  local_1d8 = 0x4000000000000000;
  local_290[1] = 0xfffffffd;
  __l_01._M_len = 1;
  __l_01._M_array = local_290 + 1;
  std::vector<int,_std::allocator<int>_>::vector(&local_2d8,__l_01,&local_3fb);
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,&local_2d8);
  local_1b8 = &DAT_4008000000000000;
  local_290[0] = -4;
  __l_02._M_len = 1;
  __l_02._M_array = local_290;
  std::vector<int,_std::allocator<int>_>::vector(&local_2f0,__l_02,&local_3fc);
  std::vector<int,_std::allocator<int>_>::vector(&local_1b0,&local_2f0);
  local_198 = 0x4010000000000000;
  local_290[0xe] = -1;
  local_290[0xf] = -2;
  __l_03._M_len = 2;
  __l_03._M_array = local_290 + 0xe;
  std::vector<int,_std::allocator<int>_>::vector(&local_308,__l_03,&local_3fd);
  std::vector<int,_std::allocator<int>_>::vector(&local_190,&local_308);
  local_178 = 0x4028000000000000;
  local_290[0xc] = -1;
  local_290[0xd] = -3;
  __l_04._M_len = 2;
  __l_04._M_array = local_290 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_320,__l_04,&local_3fe);
  std::vector<int,_std::allocator<int>_>::vector(&local_170,&local_320);
  local_158 = &DAT_402a000000000000;
  local_290[10] = -1;
  local_290[0xb] = -4;
  __l_05._M_len = 2;
  __l_05._M_array = local_290 + 10;
  std::vector<int,_std::allocator<int>_>::vector(&local_338,__l_05,&local_3ff);
  std::vector<int,_std::allocator<int>_>::vector(&local_150,&local_338);
  local_138 = 0x402c000000000000;
  local_290[8] = -2;
  local_290[9] = -3;
  __l_06._M_len = 2;
  __l_06._M_array = local_290 + 8;
  std::vector<int,_std::allocator<int>_>::vector(&local_350,__l_06,&local_400);
  std::vector<int,_std::allocator<int>_>::vector(&local_130,&local_350);
  local_118 = 0x4037000000000000;
  local_290[6] = -2;
  local_290[7] = -4;
  __l_07._M_len = 2;
  __l_07._M_array = local_290 + 6;
  std::vector<int,_std::allocator<int>_>::vector(&local_368,__l_07,&local_401);
  std::vector<int,_std::allocator<int>_>::vector(&local_110,&local_368);
  local_f8 = 0x4038000000000000;
  local_290[4] = -3;
  local_290[5] = -4;
  __l_08._M_len = 2;
  __l_08._M_array = local_290 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_380,__l_08,&local_402);
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,&local_380);
  local_d8 = 0x4041000000000000;
  local_230._4_8_ = 0xfffffffeffffffff;
  local_224 = 0xfffffffd;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)(local_230 + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_398,__l_09,&local_403);
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,&local_398);
  local_b8 = 0x405ec00000000000;
  local_290[0x16] = -1;
  local_290[0x17] = -2;
  local_230._0_4_ = 0xfffffffc;
  __l_10._M_len = 3;
  __l_10._M_array = local_290 + 0x16;
  std::vector<int,_std::allocator<int>_>::vector(&local_3b0,__l_10,&local_404);
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,&local_3b0);
  local_98 = 0x405f000000000000;
  local_290[0x13] = -1;
  local_290[0x14] = -3;
  local_290[0x15] = 0xfffffffc;
  __l_11._M_len = 3;
  __l_11._M_array = local_290 + 0x13;
  std::vector<int,_std::allocator<int>_>::vector(&local_3c8,__l_11,&local_405);
  std::vector<int,_std::allocator<int>_>::vector(&local_90,&local_3c8);
  local_78 = 0x4060c00000000000;
  local_290[0x10] = -2;
  local_290[0x11] = -3;
  local_290[0x12] = 0xfffffffc;
  __l_12._M_len = 3;
  __l_12._M_array = local_290 + 0x10;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e0,__l_12,&local_406);
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&local_3e0);
  local_58 = 0x406d400000000000;
  local_220[0] = -0x100000001;
  local_220[1] = 0xfffffffcfffffffd;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)local_220;
  std::vector<int,_std::allocator<int>_>::vector(&local_3f8,__l_13,&local_407);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,&local_3f8);
  local_38 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<int,std::allocator<int>>,std::pair<std::vector<int,std::allocator<int>>const,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<int,std::allocator<int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<int,std::allocator<int>>const,double>const*>();
  lVar2 = 0x1e0;
  do {
    pvVar1 = *(void **)(local_230 + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_220 + lVar2) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 0);
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

Polynomial<int32_t, double> GeneratePolynomialINT() {
   
   Polynomial<int32_t, double> polynomial {
      //linear biases
      {{-1}, 1.0}, {{-2}, 2.0}, {{-3}, 3.0}, {{-4}, 4.0},
      //quadratic biases
      {{-1, -2}, 12.0}, {{-1, -3}, 13.0}, {{-1, -4}, 14.0},
      {{-2, -3}, 23.0}, {{-2, -4}, 24.0},
      {{-3, -4}, 34.0},
      //polynomial biases
      {{-1, -2, -3}, 123.0}, {{-1, -2, -4}, 124.0}, {{-1, -3, -4}, 134.0},
      {{-2, -3, -4}, 234.0},
      {{-1, -2, -3, -4}, 1234.0}
   };
   
   return polynomial;
}